

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

void __thiscall glTF::Asset::Asset(Asset *this,IOSystem *io)

{
  IOSystem *io_local;
  Asset *this_local;
  
  this->mIOSystem = io;
  std::__cxx11::string::string((string *)&this->mCurrentAssetDir);
  std::vector<glTF::LazyDictBase_*,_std::allocator<glTF::LazyDictBase_*>_>::vector(&this->mDicts);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->mUsedIds);
  Ref<glTF::Buffer>::Ref(&this->mBodyBuffer);
  AssetMetadata::AssetMetadata(&this->asset);
  LazyDict<glTF::Accessor>::LazyDict(&this->accessors,this,"accessors",(char *)0x0);
  LazyDict<glTF::Animation>::LazyDict(&this->animations,this,"animations",(char *)0x0);
  LazyDict<glTF::Buffer>::LazyDict(&this->buffers,this,"buffers",(char *)0x0);
  LazyDict<glTF::BufferView>::LazyDict(&this->bufferViews,this,"bufferViews",(char *)0x0);
  LazyDict<glTF::Camera>::LazyDict(&this->cameras,this,"cameras",(char *)0x0);
  LazyDict<glTF::Image>::LazyDict(&this->images,this,"images",(char *)0x0);
  LazyDict<glTF::Material>::LazyDict(&this->materials,this,"materials",(char *)0x0);
  LazyDict<glTF::Mesh>::LazyDict(&this->meshes,this,"meshes",(char *)0x0);
  LazyDict<glTF::Node>::LazyDict(&this->nodes,this,"nodes",(char *)0x0);
  LazyDict<glTF::Sampler>::LazyDict(&this->samplers,this,"samplers",(char *)0x0);
  LazyDict<glTF::Scene>::LazyDict(&this->scenes,this,"scenes",(char *)0x0);
  LazyDict<glTF::Skin>::LazyDict(&this->skins,this,"skins",(char *)0x0);
  LazyDict<glTF::Texture>::LazyDict(&this->textures,this,"textures",(char *)0x0);
  LazyDict<glTF::Light>::LazyDict(&this->lights,this,"lights","KHR_materials_common");
  Ref<glTF::Scene>::Ref(&this->scene);
  memset(&this->extensionsUsed,0,2);
  return;
}

Assistant:

Asset(IOSystem* io = 0)
            : mIOSystem(io)
            , asset()
            , accessors     (*this, "accessors")
            , animations    (*this, "animations")
            , buffers       (*this, "buffers")
            , bufferViews   (*this, "bufferViews")
            , cameras       (*this, "cameras")
            , images        (*this, "images")
            , materials     (*this, "materials")
            , meshes        (*this, "meshes")
            , nodes         (*this, "nodes")
            //, programs    (*this, "programs")
            , samplers      (*this, "samplers")
            , scenes        (*this, "scenes")
            //, shaders     (*this, "shaders")
            , skins       (*this, "skins")
            //, techniques  (*this, "techniques")
            , textures      (*this, "textures")
            , lights        (*this, "lights", "KHR_materials_common")
        {
            memset(&extensionsUsed, 0, sizeof(extensionsUsed));
        }